

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Grammar::buildExtendedGrammar(Grammar *this)

{
  pointer pRVar1;
  Grammar *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>,_bool> pVar2;
  value_type *__x;
  list<Rule,_std::allocator<Rule>_> *in_stack_ffffffffffffff70;
  Rule *this_00;
  RulePointer *this_01;
  const_iterator __position;
  Name local_68;
  _List_node_base *p_Stack_60;
  _List_node_base *local_58;
  size_t sStack_50;
  Name in_stack_ffffffffffffffb8;
  iterator local_38;
  _List_const_iterator<Rule> local_30;
  _List_node_base *local_28;
  _List_node_base *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (_List_node_base *)intern(in_RDI,in_stack_ffffffffffffffb8._M_node);
  __position._M_node = (_List_node_base *)&in_RDI->accept_symbol;
  (in_RDI->accept_symbol)._M_node = local_20;
  __x = (value_type *)&in_RDI->rules;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<Rule,_std::allocator<Rule>_>::end(in_stack_ffffffffffffff70);
  std::_List_const_iterator<Rule>::_List_const_iterator(&local_30,&local_38);
  local_58 = (_List_node_base *)0x0;
  sStack_50 = 0;
  local_68._M_node = (_List_node_base *)0x0;
  p_Stack_60 = (_List_node_base *)0x0;
  this_00 = (Rule *)&local_68;
  Rule::Rule(this_00);
  local_28 = (_List_node_base *)
             std::__cxx11::list<Rule,_std::allocator<Rule>_>::insert
                       ((list<Rule,_std::allocator<Rule>_> *)this_00,__position,__x);
  this_01 = &in_RDI->goal;
  (in_RDI->goal)._M_node = local_28;
  Rule::~Rule((Rule *)0x11ea59);
  pRVar1 = std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11ea63);
  (pRVar1->lhs)._M_node = (in_RDI->accept_symbol)._M_node;
  std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11ea7c);
  std::__cxx11::list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
  push_back((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_> *)
            in_RDI,(value_type *)this_01);
  std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11ea9e);
  std::__cxx11::list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
  push_back((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_> *)
            in_RDI,(value_type *)this_01);
  pVar2 = std::
          set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::insert((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                    *)this_01,&this_00->lhs);
  local_18 = (_Base_ptr)pVar2.first._M_node;
  local_10 = pVar2.second;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Grammar::buildExtendedGrammar ()
{
  accept_symbol = intern ("$accept");
  goal = rules.insert (rules.end (), Rule ());
  goal->lhs = accept_symbol;
  goal->rhs.push_back (start);
  goal->rhs.push_back (tk_end);

  non_terminals.insert (accept_symbol);
}